

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddText(ImDrawList *this,ImFont *font,float font_size,ImVec2 *pos,ImU32 col,
                   char *text_begin,char *text_end,float wrap_width,ImVec4 *cpu_fine_clip_rect)

{
  value_type pvVar1;
  size_t sVar2;
  value_type *ppvVar3;
  value_type *pvVar4;
  float fVar5;
  undefined1 local_54 [8];
  ImVec4 clip_rect;
  float wrap_width_local;
  char *text_end_local;
  char *text_begin_local;
  ImU32 col_local;
  ImVec2 *pos_local;
  ImFont *pIStack_18;
  float font_size_local;
  ImFont *font_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    clip_rect.z = wrap_width;
    unique0x100001a2 = text_end;
    if (text_end == (char *)0x0) {
      sVar2 = strlen(text_begin);
      register0x00000000 = text_begin + sVar2;
    }
    if (text_begin != stack0xffffffffffffffc0) {
      pIStack_18 = font;
      if (font == (ImFont *)0x0) {
        pIStack_18 = this->_Data->Font;
      }
      pos_local._4_4_ = font_size;
      if ((font_size == 0.0) && (!NAN(font_size))) {
        pos_local._4_4_ = this->_Data->FontSize;
      }
      pvVar1 = pIStack_18->ContainerAtlas->TexID;
      ppvVar3 = ImVector<void_*>::back(&this->_TextureIdStack);
      if (pvVar1 != *ppvVar3) {
        __assert_fail("font->ContainerAtlas->TexID == _TextureIdStack.back()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                      ,0x465,
                      "void ImDrawList::AddText(const ImFont *, float, const ImVec2 &, ImU32, const char *, const char *, float, const ImVec4 *)"
                     );
      }
      pvVar4 = ImVector<ImVec4>::back(&this->_ClipRectStack);
      local_54._0_4_ = pvVar4->x;
      local_54._4_4_ = pvVar4->y;
      clip_rect.x = pvVar4->z;
      clip_rect.y = pvVar4->w;
      if (cpu_fine_clip_rect != (ImVec4 *)0x0) {
        fVar5 = ImMax((float)local_54._0_4_,cpu_fine_clip_rect->x);
        local_54._0_4_ = fVar5;
        fVar5 = ImMax((float)local_54._4_4_,cpu_fine_clip_rect->y);
        local_54._4_4_ = fVar5;
        fVar5 = ImMin(clip_rect.x,cpu_fine_clip_rect->z);
        clip_rect.x = fVar5;
        fVar5 = ImMin(clip_rect.y,cpu_fine_clip_rect->w);
        clip_rect.y = fVar5;
      }
      ImFont::RenderText(pIStack_18,this,pos_local._4_4_,*pos,col,(ImVec4 *)local_54,text_begin,
                         stack0xffffffffffffffc0,clip_rect.z,cpu_fine_clip_rect != (ImVec4 *)0x0);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddText(const ImFont* font, float font_size, const ImVec2& pos, ImU32 col, const char* text_begin, const char* text_end, float wrap_width, const ImVec4* cpu_fine_clip_rect)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (text_end == NULL)
        text_end = text_begin + strlen(text_begin);
    if (text_begin == text_end)
        return;

    // Pull default font/size from the shared ImDrawListSharedData instance
    if (font == NULL)
        font = _Data->Font;
    if (font_size == 0.0f)
        font_size = _Data->FontSize;

    IM_ASSERT(font->ContainerAtlas->TexID == _TextureIdStack.back());  // Use high-level ImGui::PushFont() or low-level ImDrawList::PushTextureId() to change font.

    ImVec4 clip_rect = _ClipRectStack.back();
    if (cpu_fine_clip_rect)
    {
        clip_rect.x = ImMax(clip_rect.x, cpu_fine_clip_rect->x);
        clip_rect.y = ImMax(clip_rect.y, cpu_fine_clip_rect->y);
        clip_rect.z = ImMin(clip_rect.z, cpu_fine_clip_rect->z);
        clip_rect.w = ImMin(clip_rect.w, cpu_fine_clip_rect->w);
    }
    font->RenderText(this, font_size, pos, col, clip_rect, text_begin, text_end, wrap_width, cpu_fine_clip_rect != NULL);
}